

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O0

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,longlong i)

{
  string local_38;
  longlong local_18;
  longlong i_local;
  Pipeline *this_local;
  
  local_18 = i;
  i_local = (longlong)this;
  std::__cxx11::to_string(&local_38,i);
  writeString(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(long long i)
{
    this->writeString(std::to_string(i));
    return *this;
}